

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

int read_intra_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,BLOCK_SIZE bsize,aom_reader *r,int skip)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint8_t *__s;
  
  if ((cm->seg).enabled == '\0') {
    uVar5 = 0;
  }
  else {
    iVar2 = xd->mi_row;
    iVar3 = xd->mi_col;
    iVar4 = (cm->mi_params).mi_cols;
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
    uVar7 = (cm->mi_params).mi_rows - iVar2;
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bsize] <= (int)uVar7) {
      uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bsize];
    }
    uVar5 = read_segment_id(cm,xd,r,skip);
    if (0 < (int)uVar7) {
      __s = cm->cur_frame->seg_map + (iVar2 * iVar4 + iVar3);
      uVar6 = iVar4 - iVar3;
      if ((int)(uint)bVar1 <= (int)uVar6) {
        uVar6 = (uint)bVar1;
      }
      uVar8 = (ulong)uVar7;
      do {
        memset(__s,uVar5 & 0xff,(long)(int)uVar6);
        __s = __s + iVar4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  return uVar5;
}

Assistant:

static int read_intra_segment_id(AV1_COMMON *const cm,
                                 const MACROBLOCKD *const xd, BLOCK_SIZE bsize,
                                 aom_reader *r, int skip) {
  struct segmentation *const seg = &cm->seg;
  if (!seg->enabled) return 0;  // Default for disabled segmentation
  assert(seg->update_map && !seg->temporal_update);

  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_stride = cm->mi_params.mi_cols;
  const int mi_offset = mi_row * mi_stride + mi_col;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int x_mis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int y_mis = AOMMIN(mi_params->mi_rows - mi_row, bh);
  const int segment_id = read_segment_id(cm, xd, r, skip);
  set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                 segment_id);
  return segment_id;
}